

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

string * __thiscall zmq::message_t::str_abi_cxx11_(string *__return_storage_ptr__,message_t *this)

{
  uint *puVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  void *pvVar6;
  size_t sVar7;
  ostream *poVar8;
  char *pcVar9;
  size_t sVar10;
  byte bVar11;
  stringstream os;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&os);
  pvVar6 = data(this);
  sVar7 = size(this);
  poVar8 = std::operator<<((ostream *)local_1a8,"zmq::message_t [size ");
  lVar3 = *(long *)poVar8;
  lVar4 = *(long *)(lVar3 + -0x18);
  *(uint *)(poVar8 + lVar4 + 0x18) = *(uint *)(poVar8 + lVar4 + 0x18) & 0xffffffb5 | 2;
  *(undefined8 *)(poVar8 + *(long *)(lVar3 + -0x18) + 0x10) = 3;
  poVar8 = std::operator<<(poVar8,0x30);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::operator<<(poVar8,"] (");
  if (sVar7 < 1000) {
    bVar5 = false;
    for (sVar10 = 0; sVar7 != sVar10; sVar10 = sVar10 + 1) {
      bVar2 = *(byte *)((long)pvVar6 + sVar10);
      bVar11 = bVar2 - 0x20;
      if (bVar5 != bVar11 < 0x5f) {
        std::operator<<((ostream *)local_1a8," ");
      }
      if (bVar11 < 0x5f) {
        std::operator<<((ostream *)local_1a8,bVar2);
      }
      else {
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
        *puVar1 = *puVar1 | 0x4000;
        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
        poVar8 = std::operator<<(local_1a8,0x30);
        std::ostream::operator<<(poVar8,(ushort)bVar2);
      }
      bVar5 = bVar11 < 0x5f;
    }
    pcVar9 = ")";
  }
  else {
    pcVar9 = "... too big to print)";
  }
  std::operator<<((ostream *)local_1a8,pcVar9);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
    {
        // Partly mutuated from the same method in zmq::multipart_t
        std::stringstream os;

        const unsigned char *msg_data = this->data<unsigned char>();
        unsigned char byte;
        size_t size = this->size();
        int is_ascii[2] = {0, 0};

        os << "zmq::message_t [size " << std::dec << std::setw(3)
           << std::setfill('0') << size << "] (";
        // Totally arbitrary
        if (size >= 1000) {
            os << "... too big to print)";
        } else {
            while (size--) {
                byte = *msg_data++;

                is_ascii[1] = (byte >= 32 && byte < 127);
                if (is_ascii[1] != is_ascii[0])
                    os << " "; // Separate text/non text

                if (is_ascii[1]) {
                    os << byte;
                } else {
                    os << std::hex << std::uppercase << std::setw(2)
                       << std::setfill('0') << static_cast<short>(byte);
                }
                is_ascii[0] = is_ascii[1];
            }
            os << ")";
        }
        return os.str();
    }